

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O0

int __thiscall NetworkAddress::serialise(NetworkAddress *this,uint8_t *buf,size_t max_len)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint8_t *ptr;
  int i;
  size_t max_len_local;
  uint8_t *buf_local;
  NetworkAddress *this_local;
  
  this_local._4_4_ = BER_CONTAINER::serialise(&this->super_BER_CONTAINER,buf,max_len,4);
  if (-1 < this_local._4_4_) {
    puVar1 = buf + this_local._4_4_;
    puVar2 = IPAddress::operator[](&this->_value,0);
    *puVar1 = *puVar2;
    puVar2 = IPAddress::operator[](&this->_value,1);
    puVar1[1] = *puVar2;
    puVar2 = IPAddress::operator[](&this->_value,2);
    puVar1[2] = *puVar2;
    puVar2 = IPAddress::operator[](&this->_value,3);
    puVar1[3] = *puVar2;
    this_local._4_4_ = ((int)puVar1 + 4) - (int)buf;
  }
  return this_local._4_4_;
}

Assistant:

int NetworkAddress::serialise(uint8_t* buf, size_t max_len){
    int i = BER_CONTAINER::serialise(buf, max_len, 4);
    CHECK_ENCODE_ERR(i);
    uint8_t *ptr = buf + i;
    
    *ptr++ = _value[0];
    *ptr++ = _value[1];
    *ptr++ = _value[2];
    *ptr++ = _value[3];

    return ptr - buf;
}